

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMDetector.cpp
# Opt level: O0

bool __thiscall
ZXing::DataMatrix::EdgeTracer::traceLine(EdgeTracer *this,PointF dEdge,RegressionLine *line)

{
  PointT<double> d;
  PointI p;
  PointI p_00;
  PointT<double> p_01;
  PointF p_02;
  PointF p_03;
  PointF d_00;
  PointT<double> pos;
  PointT<double> pos_00;
  PointT<double> pos_01;
  bool bVar1;
  int iVar2;
  vector<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_> *pvVar3;
  size_type sVar4;
  long lVar5;
  int *piVar6;
  value_t_conflict2 *pvVar7;
  RegressionLine *in_RSI;
  long in_RDI;
  StepResult stepResult;
  int j;
  PointT<double> pEdge;
  int i;
  int step;
  int breadth;
  Matrix<signed_char> *in_stack_fffffffffffffde8;
  int in_stack_fffffffffffffdf0;
  int in_stack_fffffffffffffdf4;
  RegressionLine *in_stack_fffffffffffffdf8;
  RegressionLine *in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe08;
  int in_stack_fffffffffffffe0c;
  uint in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe14;
  undefined8 in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  uint uVar8;
  int local_1d8;
  bool local_151;
  PointT<int> local_110;
  PointT<int> local_108;
  double local_100;
  double local_f8;
  PointF local_f0;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  int local_c0;
  int local_bc;
  PointT<double> local_b8;
  double local_a8;
  double local_a0;
  PointT<double> local_98;
  PointT<double> local_88;
  PointT<double> local_78;
  PointT<double> local_68;
  uint local_54;
  int local_50;
  int local_4c;
  PointT<double> local_38;
  byte local_25;
  int local_24 [3];
  double local_18;
  double local_10;
  int local_4;
  
  d_00.y._0_4_ = in_stack_fffffffffffffe20;
  d_00.x = (double)in_stack_fffffffffffffe18;
  d_00.y._4_4_ = in_stack_fffffffffffffe24;
  RegressionLine::setDirectionInward
            ((RegressionLine *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),d_00);
LAB_00275895:
  log<double>(*(PointT<double> *)(in_RDI + 8),0);
  p_03.x._4_4_ = in_stack_fffffffffffffe0c;
  p_03.x._0_4_ = in_stack_fffffffffffffe08;
  p_03.y._0_4_ = in_stack_fffffffffffffe10;
  p_03.y._4_4_ = in_stack_fffffffffffffe14;
  RegressionLine::add(in_stack_fffffffffffffe00,p_03);
  pvVar3 = RegressionLine::points(in_RSI);
  sVar4 = std::vector<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>::size(pvVar3);
  if ((sVar4 % 0x32 == 10) &&
     (bVar1 = updateDirectionFromLineCentroid
                        ((EdgeTracer *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8), !bVar1)
     ) {
    return false;
  }
  local_25 = RegressionLine::isValid((RegressionLine *)0x27596a);
  local_24[0] = 1;
  d.y._0_4_ = in_stack_fffffffffffffdf0;
  d.x = (double)in_stack_fffffffffffffde8;
  d.y._4_4_ = in_stack_fffffffffffffdf4;
  local_38 = mainDirection<double>(d);
  local_18 = local_38.x;
  local_10 = local_38.y;
  local_4c = 1;
  while( true ) {
    if (local_24[0] == 1) {
      local_1d8 = 2;
    }
    else {
      local_1d8 = 3;
      if ((local_25 & 1) != 0) {
        local_1d8 = 1;
      }
    }
    if (local_1d8 < local_4c) break;
    for (local_50 = 1; local_50 <= local_24[0]; local_50 = local_50 + 1) {
      for (local_54 = 0; (int)local_54 <= (local_50 / 4 + 1) * 2 * local_4c; local_54 = local_54 + 1
          ) {
        lVar5 = in_RDI + 8;
        uVar8 = local_54;
        local_88 = ZXing::operator*(in_stack_fffffffffffffdf4,
                                    (PointT<double> *)in_stack_fffffffffffffde8);
        local_78 = operator+<double,_double>
                             ((PointT<double> *)
                              CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                              (PointT<double> *)in_stack_fffffffffffffde8);
        if ((local_54 & 1) == 0) {
          iVar2 = -local_54;
        }
        else {
          iVar2 = local_54 + 1;
        }
        in_stack_fffffffffffffe14 = iVar2 / 2;
        local_98 = ZXing::operator*(in_stack_fffffffffffffdf4,
                                    (PointT<double> *)in_stack_fffffffffffffde8);
        local_68 = operator+<double,_double>
                             ((PointT<double> *)
                              CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                              (PointT<double> *)in_stack_fffffffffffffde8);
        local_a8 = local_68.x;
        local_a0 = local_68.y;
        log<double>(local_68,0);
        local_b8 = operator+<double,_double>
                             ((PointT<double> *)
                              CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                              (PointT<double> *)in_stack_fffffffffffffde8);
        pos.y._0_4_ = in_stack_fffffffffffffe20;
        pos.x = (double)lVar5;
        pos.y._4_4_ = uVar8;
        bVar1 = BitMatrixCursor<ZXing::PointT<double>_>::blackAt
                          ((BitMatrixCursor<ZXing::PointT<double>_> *)
                           CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),pos);
        if (bVar1) {
          local_bc = 0;
          goto LAB_00275c52;
        }
      }
    }
    local_4c = local_4c + 1;
  }
  local_4 = 1;
  goto LAB_00275fa5;
LAB_00275c52:
  local_c0 = 3;
  in_stack_fffffffffffffe0c = local_bc;
  piVar6 = std::max<int>(local_24,&local_c0);
  in_stack_fffffffffffffe10 = in_stack_fffffffffffffe10 & 0xffffff;
  if (in_stack_fffffffffffffe0c < *piVar6) {
    local_d0 = local_68.x;
    local_c8 = local_68.y;
    p_01.y = (double)in_stack_fffffffffffffe00;
    p_01.x = (double)in_stack_fffffffffffffdf8;
    bVar1 = BitMatrixCursor<ZXing::PointT<double>_>::isIn
                      ((BitMatrixCursor<ZXing::PointT<double>_> *)
                       CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),p_01);
    in_stack_fffffffffffffe10 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe10);
  }
  if ((char)(in_stack_fffffffffffffe10 >> 0x18) == '\0') {
    local_4 = 2;
    goto LAB_00275fa5;
  }
  local_e0 = local_68.x;
  local_d8 = local_68.y;
  pos_00.y._0_4_ = in_stack_fffffffffffffe20;
  pos_00.x = (double)lVar5;
  pos_00.y._4_4_ = uVar8;
  bVar1 = BitMatrixCursor<ZXing::PointT<double>_>::whiteAt
                    ((BitMatrixCursor<ZXing::PointT<double>_> *)
                     CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),pos_00);
  if (bVar1) goto LAB_00275d20;
  local_68 = operator-<double,_double>
                       ((PointT<double> *)
                        CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                        (PointT<double> *)in_stack_fffffffffffffde8);
  operator-<double,_double>
            ((PointT<double> *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
             (PointT<double> *)in_stack_fffffffffffffde8);
  pos_01.y._0_4_ = in_stack_fffffffffffffe20;
  pos_01.x = (double)lVar5;
  pos_01.y._4_4_ = uVar8;
  bVar1 = BitMatrixCursor<ZXing::PointT<double>_>::blackAt
                    ((BitMatrixCursor<ZXing::PointT<double>_> *)
                     CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),pos_01);
  if (bVar1) {
    local_68 = operator-<double,_double>
                         ((PointT<double> *)
                          CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                          (PointT<double> *)in_stack_fffffffffffffde8);
  }
  log<double>(local_68,0);
  local_bc = local_bc + 1;
  goto LAB_00275c52;
LAB_00275d20:
  local_100 = local_68.x;
  local_f8 = local_68.y;
  p_02.y = (double)in_stack_fffffffffffffe00;
  p_02.x = (double)in_stack_fffffffffffffdf8;
  local_f0 = centered(p_02);
  *(double *)(in_RDI + 8) = local_f0.x;
  *(double *)(in_RDI + 0x10) = local_f0.y;
  if ((*(long *)(in_RDI + 0x28) != 0) && (local_24[0] == 1)) {
    in_stack_fffffffffffffe00 = *(RegressionLine **)(in_RDI + 0x28);
    PointT<int>::PointT<double>(&local_108,(PointT<double> *)(in_RDI + 8));
    p.y = in_stack_fffffffffffffdf4;
    p.x = in_stack_fffffffffffffdf0;
    pvVar7 = Matrix<signed_char>::get(in_stack_fffffffffffffde8,p);
    if ((int)*pvVar7 == *(int *)(in_RDI + 0x30)) {
      local_4 = 2;
      goto LAB_00275fa5;
    }
    in_stack_fffffffffffffdf8 = *(RegressionLine **)(in_RDI + 0x28);
    PointT<int>::PointT<double>(&local_110,(PointT<double> *)(in_RDI + 8));
    p_00.y = in_stack_fffffffffffffdf4;
    p_00.x = in_stack_fffffffffffffdf0;
    Matrix<signed_char>::set(in_stack_fffffffffffffde8,p_00,'\0');
  }
  local_4 = 0;
LAB_00275fa5:
  if (local_4 != 0) {
    local_151 = false;
    if (local_4 == 1) {
      pvVar3 = RegressionLine::points(in_RSI);
      sVar4 = std::vector<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>::size
                        (pvVar3);
      local_151 = false;
      if (1 < sVar4) {
        local_151 = updateDirectionFromLineCentroid
                              ((EdgeTracer *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      }
    }
    return local_151;
  }
  goto LAB_00275895;
}

Assistant:

bool traceLine(PointF dEdge, RegressionLine& line)
	{
		line.setDirectionInward(dEdge);
		do {
			log(p);
			line.add(p);
			if (line.points().size() % 50 == 10 && !updateDirectionFromLineCentroid(line))
				return false;
			auto stepResult = traceStep(dEdge, 1, line.isValid());
			if (stepResult != StepResult::FOUND)
				return stepResult == StepResult::OPEN_END && line.points().size() > 1 && updateDirectionFromLineCentroid(line);
		} while (true);
	}